

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

bool __thiscall SuperCardPro::GetDriveStatus(SuperCardPro *this,int *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ushort *puVar6;
  bool bVar7;
  uint16_t drv_status;
  int bytes_read;
  ushort local_2e;
  int local_2c;
  
  bVar7 = false;
  bVar1 = SendCmd(this,0x8e,(void *)0x0,0,(void *)0x0,0);
  if (bVar1) {
    local_2c = 0;
    uVar5 = 2;
    puVar6 = &local_2e;
    do {
      iVar3 = (int)uVar5;
      iVar2 = (*this->_vptr_SuperCardPro[2])(this,puVar6,uVar5,&local_2c);
      if ((char)iVar2 == '\0') {
        return false;
      }
      puVar6 = (ushort *)((long)puVar6 + (long)local_2c);
      uVar4 = iVar3 - local_2c;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0 && local_2c <= iVar3);
    *status = (uint)(ushort)(local_2e << 8 | local_2e >> 8);
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool SuperCardPro::GetDriveStatus(int& status)
{
    uint16_t drv_status;

    if (!SendCmd(CMD_STATUS))
        return false;

    if (!ReadExact(&drv_status, sizeof(drv_status)))
        return false;

    status = util::betoh(drv_status);

    return true;
}